

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmarkdowntextedit.cpp
# Opt level: O0

void __thiscall QMarkdownTextEdit::updateLineNumberArea(QMarkdownTextEdit *this,QRect rect,int dy)

{
  LineNumArea *this_00;
  int ay;
  int aw;
  int ah;
  QWidget *this_01;
  ulong uVar1;
  QRect local_3c;
  QSize local_2c;
  int local_24;
  QMarkdownTextEdit *pQStack_20;
  int dy_local;
  QMarkdownTextEdit *this_local;
  QRect rect_local;
  
  rect_local._0_8_ = rect._8_8_;
  this_local = rect._0_8_;
  local_24 = dy;
  pQStack_20 = this;
  if (dy == 0) {
    this_00 = this->_lineNumArea;
    ay = QRect::y((QRect *)&this_local);
    local_2c = LineNumArea::sizeHint(this->_lineNumArea);
    aw = QSize::width(&local_2c);
    ah = QRect::height((QRect *)&this_local);
    QWidget::update(&this_00->super_QWidget,0,ay,aw,ah);
  }
  else {
    QWidget::scroll((int)this->_lineNumArea,0);
  }
  updateLineNumAreaGeometry(this);
  this_01 = (QWidget *)QAbstractScrollArea::viewport();
  local_3c = QWidget::rect(this_01);
  uVar1 = QRect::contains((QRect *)&this_local,SUB81(&local_3c,0));
  if ((uVar1 & 1) != 0) {
    updateLineNumberAreaWidth(this,0);
  }
  return;
}

Assistant:

void QMarkdownTextEdit::updateLineNumberArea(const QRect rect, int dy)
{
    if (dy)
        _lineNumArea->scroll(0, dy);
    else
        _lineNumArea->update(0, rect.y(), _lineNumArea->sizeHint().width(), rect.height());

    updateLineNumAreaGeometry();

    if (rect.contains(viewport()->rect())) {
        updateLineNumberAreaWidth(0);
    }
}